

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

Value * __thiscall
ot::commissioner::Interpreter::ProcessMigrate
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  string *this_00;
  string *this_01;
  ErrorCode EVar1;
  pointer pbVar2;
  char *pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  char *begin;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  CommissionerAppPtr commissioner;
  CommissionerAppPtr local_158;
  ErrorCode local_148;
  undefined1 *local_140;
  long local_138;
  undefined1 local_130 [16];
  ErrorCode local_120;
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  undefined1 *local_f8;
  undefined8 local_f0;
  undefined1 local_e8 [16];
  string local_d8;
  ErrorCode local_b8 [2];
  long local_b0;
  long local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  Error local_90;
  format_string_checker<char> local_68;
  
  (__return_storage_ptr__->mError).mCode = kNone;
  this_00 = &(__return_storage_ptr__->mError).mMessage;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  this_01 = &__return_storage_ptr__->mData;
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  local_158.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_158.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((ulong)((long)(aExpr->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x41) {
    local_68.types_[0] = none_type;
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ = "too few arguments"
    ;
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x11;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_68.parse_funcs_[0] = (parse_func)0x0;
    begin = "too few arguments";
    local_68.context_.types_ = local_68.types_;
    do {
      pcVar3 = begin + 1;
      if (*begin == '}') {
        if ((pcVar3 == "") || (*pcVar3 != '}')) {
          fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar3 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar3 = fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (begin,"",&local_68);
      }
      begin = pcVar3;
    } while (pcVar3 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_68;
    fmt::v10::vformat_abi_cxx11_
              (&local_d8,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args);
    local_148 = kInvalidArgs;
    local_140 = local_130;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_140,local_d8._M_dataplus._M_p,
               local_d8._M_dataplus._M_p + local_d8._M_string_length);
    local_120 = local_148;
    local_118[0] = local_108;
    std::__cxx11::string::_M_construct<char*>((string *)local_118,local_140,local_140 + local_138);
    local_f0 = 0;
    local_e8[0] = 0;
    (__return_storage_ptr__->mError).mCode = local_120;
    local_f8 = local_e8;
    std::__cxx11::string::operator=((string *)this_00,(string *)local_118);
    std::__cxx11::string::operator=((string *)this_01,(string *)&local_f8);
    if (local_f8 != local_e8) {
      operator_delete(local_f8);
    }
    if (local_118[0] != local_108) {
      operator_delete(local_118[0]);
    }
    if (local_140 != local_130) {
      operator_delete(local_140);
    }
    paVar4 = &local_d8.field_2;
  }
  else {
    JobManager::GetSelectedCommissioner
              (&local_90,
               (this->mJobManager).
               super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &local_158);
    local_120 = local_90.mCode;
    local_118[0] = local_108;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_118,local_90.mMessage._M_dataplus._M_p,
               local_90.mMessage._M_dataplus._M_p + local_90.mMessage._M_string_length);
    local_f0 = 0;
    local_e8[0] = 0;
    (__return_storage_ptr__->mError).mCode = local_120;
    local_f8 = local_e8;
    std::__cxx11::string::operator=((string *)this_00,(string *)local_118);
    std::__cxx11::string::operator=((string *)this_01,(string *)&local_f8);
    EVar1 = (__return_storage_ptr__->mError).mCode;
    if (local_f8 != local_e8) {
      operator_delete(local_f8);
    }
    if (local_118[0] != local_108) {
      operator_delete(local_118[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.mMessage._M_dataplus._M_p != &local_90.mMessage.field_2) {
      operator_delete(local_90.mMessage._M_dataplus._M_p);
    }
    if (EVar1 != kNone) goto LAB_001266c9;
    pbVar2 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    (*((local_158.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->super_CommissionerHandler)._vptr_CommissionerHandler[0x40])
              (local_b8,local_158.
                        super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,pbVar2 + 1,pbVar2 + 2);
    local_120 = local_b8[0];
    local_118[0] = local_108;
    std::__cxx11::string::_M_construct<char*>((string *)local_118,local_b0,local_a8 + local_b0);
    local_f0 = 0;
    local_e8[0] = 0;
    (__return_storage_ptr__->mError).mCode = local_120;
    local_f8 = local_e8;
    std::__cxx11::string::operator=((string *)this_00,(string *)local_118);
    std::__cxx11::string::operator=((string *)this_01,(string *)&local_f8);
    if (local_f8 != local_e8) {
      operator_delete(local_f8);
    }
    if (local_118[0] != local_108) {
      operator_delete(local_118[0]);
    }
    paVar4 = &local_a0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*(undefined1 **)(paVar4->_M_local_buf + -0x10) != paVar4) {
    operator_delete(*(undefined1 **)(paVar4->_M_local_buf + -0x10));
  }
LAB_001266c9:
  if (local_158.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_158.
               super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessMigrate(const Expression &aExpr)
{
    Value              value;
    CommissionerAppPtr commissioner = nullptr;

    VerifyOrExit(aExpr.size() >= 3, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
    SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
    SuccessOrExit(value = commissioner->Migrate(aExpr[1], aExpr[2]));
exit:
    return value;
}